

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPointer<QTextList>_>::moveAppend
          (QGenericArrayOps<QPointer<QTextList>_> *this,QPointer<QTextList> *b,
          QPointer<QTextList> *e)

{
  QPointer<QTextList> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPointer<QTextList> *in_RDI;
  QPointer<QTextList> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPointer<QTextList>_>::begin
                        ((QArrayDataPointer<QPointer<QTextList>_> *)0xa02ee7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPointer<QTextList>::QPointer(this_00,in_RDI);
      local_10 = local_10 + 0x10;
      in_RDI[1].wp.d =
           (Data *)((long)&((in_RDI[1].wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }